

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cryptohelper_test.cpp
# Opt level: O0

void __thiscall
test::test_load_and_export_public_key::test_method(test_load_and_export_public_key *this)

{
  initializer_list<unsigned_char> __l;
  unit_test_log_t *puVar1;
  bool bVar2;
  pointer pCVar3;
  size_type sVar4;
  size_type sVar5;
  lazy_ostream *plVar6;
  basic_cstring<const_char> local_200;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[48],_const_char_(&)[48]> local_1f0;
  uchar *local_1d0;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1c8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1c0;
  assertion_result local_1b8;
  basic_cstring<const_char> local_1a0;
  basic_cstring<const_char> local_190;
  basic_cstring<const_char> local_180;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[44],_const_char_(&)[44]> local_170;
  assertion_result local_150;
  basic_cstring<const_char> local_138;
  basic_cstring<const_char> local_128;
  undefined1 local_118 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> pk_exported;
  string pk_str;
  allocator<unsigned_char> local_cd;
  uchar local_cc [140];
  iterator local_40;
  size_type local_38;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> expected_pubkey;
  unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_> crypto;
  test_load_and_export_public_key *this_local;
  
  license::CryptoHelper::getInstance();
  memcpy(local_cc,&DAT_00427468,0x8c);
  local_38 = 0x8c;
  local_40 = local_cc;
  std::allocator<unsigned_char>::allocator(&local_cd);
  __l._M_len = local_38;
  __l._M_array = local_40;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,__l,&local_cd);
  std::allocator<unsigned_char>::~allocator(&local_cd);
  loadPrivateKey_abi_cxx11_();
  pCVar3 = std::unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>::
           operator->((unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>
                       *)&expected_pubkey.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  (*pCVar3->_vptr_CryptoHelper[4])
            (pCVar3,&pk_exported.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  pCVar3 = std::unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>::
           operator->((unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>
                       *)&expected_pubkey.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  (*pCVar3->_vptr_CryptoHelper[2])(local_118);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_128,
               "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/extern/license-generator/test/cryptohelper_test.cpp"
               ,0x86);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_138);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_128,0x5a,&local_138);
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
    sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_118);
    boost::test_tools::assertion_result::assertion_result(&local_150,sVar4 == sVar5);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              (&local_170,plVar6,(char (*) [44])"exported key and expected are the same size");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_180,
               "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/extern/license-generator/test/cryptohelper_test.cpp"
               ,0x86);
    boost::test_tools::tt_detail::report_assertion(&local_150,&local_170,&local_180,0x5a,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[44],_const_char_(&)[44]>::
    ~lazy_ostream_impl(&local_170);
    boost::test_tools::assertion_result::~assertion_result(&local_150);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/extern/license-generator/test/cryptohelper_test.cpp"
               ,0x86);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1a0);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_190,0x5c,&local_1a0);
    local_1c0._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
    local_1c8._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
    local_1d0 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    local_118);
    bVar2 = std::
            equal<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                      (local_1c0,local_1c8,
                       (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )local_1d0);
    boost::test_tools::assertion_result::assertion_result(&local_1b8,bVar2);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              (&local_1f0,plVar6,(char (*) [48])"exported key and expected have the same content");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/extern/license-generator/test/cryptohelper_test.cpp"
               ,0x86);
    boost::test_tools::tt_detail::report_assertion(&local_1b8,&local_1f0,&local_200,0x5c,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[48],_const_char_(&)[48]>::
    ~lazy_ostream_impl(&local_1f0);
    boost::test_tools::assertion_result::~assertion_result(&local_1b8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>::release
            ((unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_> *)
             &expected_pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_118);
  std::__cxx11::string::~string
            ((string *)
             &pk_exported.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  std::unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>::~unique_ptr
            ((unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_> *)
             &expected_pubkey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_load_and_export_public_key) {
	unique_ptr<CryptoHelper> crypto(CryptoHelper::getInstance());
	const vector<unsigned char> expected_pubkey(PUBKEY);
	const std::string pk_str = loadPrivateKey();
	crypto->loadPrivateKey(pk_str);
	vector<unsigned char> pk_exported = crypto->exportPublicKey();

	/*
	 for (auto it : pk_exported) {
	 cout << ((int)it) << ",";
	 }
	 ofstream myfile("public_key.rsa");
	 for (auto it : pk_exported) {
	 myfile << it;
	 }
	 myfile.close();*/
	BOOST_CHECK_MESSAGE(expected_pubkey.size() == pk_exported.size(), "exported key and expected are the same size");
	BOOST_CHECK_MESSAGE(std::equal(expected_pubkey.begin(), expected_pubkey.end(), pk_exported.begin()),
						"exported key and expected have the same content");
	crypto.release();
}